

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::SetAmpEnable(AmpIO *this,uint index,bool state)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t state_mask;
  uint32_t enable_mask;
  bool state_local;
  uint index_local;
  AmpIO *this_local;
  
  if (index < this->NumMotors) {
    uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
    if (uVar1 < 8) {
      uVar2 = 1 << ((byte)index & 0x1f);
      this->WriteBuffer[this->WB_CTRL_OFFSET] =
           0x100 << ((byte)index & 0x1f) | this->WriteBuffer[this->WB_CTRL_OFFSET];
      if (state) {
        this->WriteBuffer[this->WB_CTRL_OFFSET] = uVar2 | this->WriteBuffer[this->WB_CTRL_OFFSET];
      }
      else {
        this->WriteBuffer[this->WB_CTRL_OFFSET] =
             (uVar2 ^ 0xffffffff) & this->WriteBuffer[this->WB_CTRL_OFFSET];
      }
    }
    else {
      uVar2 = this->WB_CURR_OFFSET + index;
      this->WriteBuffer[uVar2] = this->WriteBuffer[uVar2] | 0x20000000;
      if (state) {
        uVar2 = this->WB_CURR_OFFSET + index;
        this->WriteBuffer[uVar2] = this->WriteBuffer[uVar2] | 0x10000000;
      }
      else {
        uVar2 = this->WB_CURR_OFFSET + index;
        this->WriteBuffer[uVar2] = this->WriteBuffer[uVar2] & 0xefffffff;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::SetAmpEnable(unsigned int index, bool state)
{
    if (index >= NumMotors)
        return false;

    if (GetFirmwareVersion() < 8) {
        uint32_t enable_mask = 0x00000100 << index;
        uint32_t state_mask  = 0x00000001 << index;
        WriteBuffer[WB_CTRL_OFFSET] |=  enable_mask;
        if (state)
            WriteBuffer[WB_CTRL_OFFSET] |=  state_mask;
        else
            WriteBuffer[WB_CTRL_OFFSET] &= ~state_mask;
    }
    else {
        WriteBuffer[WB_CURR_OFFSET + index] |=  MOTOR_ENABLE_MASK;
        if (state)
            WriteBuffer[WB_CURR_OFFSET + index] |=  MOTOR_ENABLE_BIT;
        else
            WriteBuffer[WB_CURR_OFFSET + index] &= ~MOTOR_ENABLE_BIT;
    }
    return true;
}